

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_257,_false,_embree::avx512::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  undefined8 uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [12];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  byte bVar26;
  char cVar27;
  byte bVar28;
  byte bVar29;
  size_t mask;
  ulong uVar30;
  byte bVar31;
  ushort uVar32;
  NodeRef *pNVar33;
  NodeRef root;
  size_t sVar34;
  uint uVar35;
  undefined4 uVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar37;
  bool bVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 ai_2;
  undefined1 auVar59 [16];
  vint4 bi;
  undefined1 auVar60 [16];
  vint4 bi_1;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 bi_3;
  undefined1 auVar63 [16];
  vint4 ai;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vint4 ai_1;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar73;
  float fVar74;
  vint4 bi_10;
  float fVar75;
  undefined1 auVar72 [16];
  vint4 ai_3;
  undefined1 auVar76 [16];
  vfloat4 a0;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  int iVar41;
  int iVar56;
  int iVar57;
  int iVar58;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar49 = *(undefined1 (*) [16])(ray + 0x80);
    auVar44 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar22 = ZEXT812(0) << 0x20;
    auVar45 = ZEXT816(0) << 0x40;
    uVar14 = vcmpps_avx512vl(auVar49,auVar45,5);
    uVar39 = vpcmpeqd_avx512vl(auVar44,(undefined1  [16])valid_i->field_0);
    uVar39 = ((byte)uVar14 & 0xf) & uVar39;
    bVar29 = (byte)uVar39;
    if (bVar29 != 0) {
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar7 = tray.dir.field_0._32_4_;
      auVar42._0_4_ = fVar7 * fVar7;
      fVar8 = tray.dir.field_0._36_4_;
      auVar42._4_4_ = fVar8 * fVar8;
      fVar9 = tray.dir.field_0._40_4_;
      auVar42._8_4_ = fVar9 * fVar9;
      fVar10 = tray.dir.field_0._44_4_;
      auVar42._12_4_ = fVar10 * fVar10;
      auVar43 = vfmadd231ps_fma(auVar42,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar43 = vfmadd231ps_fma(auVar43,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar42 = vrsqrt14ps_avx512vl(auVar43);
      auVar48._8_4_ = 0xbf000000;
      auVar48._0_8_ = 0xbf000000bf000000;
      auVar48._12_4_ = 0xbf000000;
      auVar43 = vmulps_avx512vl(auVar43,auVar48);
      fVar71 = auVar42._0_4_;
      fVar73 = auVar42._4_4_;
      fVar74 = auVar42._8_4_;
      fVar75 = auVar42._12_4_;
      auVar50._0_4_ = fVar71 * fVar71 * fVar71 * auVar43._0_4_;
      auVar50._4_4_ = fVar73 * fVar73 * fVar73 * auVar43._4_4_;
      auVar50._8_4_ = fVar74 * fVar74 * fVar74 * auVar43._8_4_;
      auVar50._12_4_ = fVar75 * fVar75 * fVar75 * auVar43._12_4_;
      auVar43._8_4_ = 0x3fc00000;
      auVar43._0_8_ = 0x3fc000003fc00000;
      auVar43._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar50,auVar42,auVar43);
      auVar51._8_4_ = 0x80000000;
      auVar51._0_8_ = 0x8000000080000000;
      auVar51._12_4_ = 0x80000000;
      uVar30 = uVar39;
      do {
        lVar15 = 0;
        for (uVar40 = uVar30; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
          lVar15 = lVar15 + 1;
        }
        uVar40 = (ulong)(uint)((int)lVar15 * 4);
        auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar40 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar40 + 0x50)),0x1c);
        fVar71 = *(float *)((long)pre.ray_space + (uVar40 - 0x10));
        auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + uVar40 + 0x60)),0x28);
        auVar77._0_4_ = auVar43._0_4_ * fVar71;
        auVar77._4_4_ = auVar43._4_4_ * fVar71;
        auVar77._8_4_ = auVar43._8_4_ * fVar71;
        auVar77._12_4_ = auVar43._12_4_ * fVar71;
        auVar48 = vshufpd_avx(auVar77,auVar77,1);
        auVar43 = vmovshdup_avx(auVar77);
        auVar83._0_4_ = auVar43._0_4_ ^ 0x80000000;
        auVar50 = vunpckhps_avx(auVar77,auVar45);
        auVar80._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
        auVar80._8_8_ = auVar48._8_8_ ^ auVar51._8_8_;
        auVar42 = vinsertps_avx(auVar80,auVar77,0x2a);
        auVar43 = vdpps_avx(auVar42,auVar42,0x7f);
        auVar83._4_12_ = auVar22;
        auVar50 = vshufps_avx(auVar50,auVar83,0x41);
        auVar48 = vdpps_avx(auVar50,auVar50,0x7f);
        uVar14 = vcmpps_avx512vl(auVar43,auVar48,1);
        auVar43 = vpmovm2d_avx512vl(uVar14);
        auVar86._0_4_ = auVar43._0_4_;
        auVar86._4_4_ = auVar86._0_4_;
        auVar86._8_4_ = auVar86._0_4_;
        auVar86._12_4_ = auVar86._0_4_;
        uVar40 = vpmovd2m_avx512vl(auVar86);
        auVar55._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar44._4_4_;
        auVar55._0_4_ = (uint)((byte)uVar40 & 1) * auVar44._0_4_;
        auVar55._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar44._8_4_;
        auVar55._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar44._12_4_;
        auVar43 = vblendvps_avx(auVar42,auVar50,auVar55);
        auVar48 = vdpps_avx(auVar43,auVar43,0x7f);
        auVar87._4_12_ = auVar22;
        auVar87._0_4_ = auVar48._0_4_;
        auVar42 = vrsqrt14ss_avx512f(auVar45,auVar87);
        fVar73 = auVar42._0_4_;
        fVar73 = fVar73 * 1.5 - auVar48._0_4_ * 0.5 * fVar73 * fVar73 * fVar73;
        auVar81._0_4_ = auVar43._0_4_ * fVar73;
        auVar81._4_4_ = auVar43._4_4_ * fVar73;
        auVar81._8_4_ = auVar43._8_4_ * fVar73;
        auVar81._12_4_ = auVar43._12_4_ * fVar73;
        auVar43 = vshufps_avx(auVar81,auVar81,0xc9);
        auVar48 = vshufps_avx(auVar77,auVar77,0xc9);
        auVar88._0_4_ = auVar81._0_4_ * auVar48._0_4_;
        auVar88._4_4_ = auVar81._4_4_ * auVar48._4_4_;
        auVar88._8_4_ = auVar81._8_4_ * auVar48._8_4_;
        auVar88._12_4_ = auVar81._12_4_ * auVar48._12_4_;
        auVar43 = vfmsub231ps_fma(auVar88,auVar77,auVar43);
        auVar48 = vshufps_avx(auVar43,auVar43,0xc9);
        auVar43 = vdpps_avx(auVar48,auVar48,0x7f);
        uVar30 = uVar30 - 1 & uVar30;
        auVar89._4_12_ = auVar22;
        auVar89._0_4_ = auVar43._0_4_;
        auVar42 = vrsqrt14ss_avx512f(auVar45,auVar89);
        fVar73 = auVar42._0_4_;
        fVar73 = fVar73 * 1.5 - auVar43._0_4_ * 0.5 * fVar73 * fVar73 * fVar73;
        auVar84._0_4_ = fVar73 * auVar48._0_4_;
        auVar84._4_4_ = fVar73 * auVar48._4_4_;
        auVar84._8_4_ = fVar73 * auVar48._8_4_;
        auVar84._12_4_ = fVar73 * auVar48._12_4_;
        auVar78._0_4_ = fVar71 * auVar77._0_4_;
        auVar78._4_4_ = fVar71 * auVar77._4_4_;
        auVar78._8_4_ = fVar71 * auVar77._8_4_;
        auVar78._12_4_ = fVar71 * auVar77._12_4_;
        auVar42 = vunpcklps_avx(auVar81,auVar78);
        auVar43 = vunpckhps_avx(auVar81,auVar78);
        auVar50 = vunpcklps_avx(auVar84,auVar45);
        auVar48 = vunpckhps_avx(auVar84,auVar45);
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar43,auVar48);
        aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar42,auVar50);
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar42,auVar50);
        pre.ray_space[lVar15].vx.field_0 = aVar13;
        pre.ray_space[lVar15].vy.field_0 = aVar11;
        pre.ray_space[lVar15].vz.field_0 = aVar12;
      } while (uVar30 != 0);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar90 = ZEXT1664(auVar44);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar91 = ZEXT1664(auVar45);
      auVar43 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar44);
      uVar30 = vcmpps_avx512vl(auVar43,auVar45,1);
      bVar38 = (bool)((byte)uVar30 & 1);
      iVar41 = auVar45._0_4_;
      auVar46._0_4_ = (uint)bVar38 * iVar41 | (uint)!bVar38 * tray.dir.field_0._0_4_;
      bVar38 = (bool)((byte)(uVar30 >> 1) & 1);
      iVar56 = auVar45._4_4_;
      auVar46._4_4_ = (uint)bVar38 * iVar56 | (uint)!bVar38 * tray.dir.field_0._4_4_;
      bVar38 = (bool)((byte)(uVar30 >> 2) & 1);
      iVar57 = auVar45._8_4_;
      iVar58 = auVar45._12_4_;
      auVar46._8_4_ = (uint)bVar38 * iVar57 | (uint)!bVar38 * tray.dir.field_0._8_4_;
      bVar38 = (bool)((byte)(uVar30 >> 3) & 1);
      auVar46._12_4_ = (uint)bVar38 * iVar58 | (uint)!bVar38 * tray.dir.field_0._12_4_;
      auVar43 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar44);
      uVar30 = vcmpps_avx512vl(auVar43,auVar45,1);
      bVar38 = (bool)((byte)uVar30 & 1);
      auVar47._0_4_ = (uint)bVar38 * iVar41 | (uint)!bVar38 * tray.dir.field_0._16_4_;
      bVar38 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar47._4_4_ = (uint)bVar38 * iVar56 | (uint)!bVar38 * tray.dir.field_0._20_4_;
      bVar38 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar47._8_4_ = (uint)bVar38 * iVar57 | (uint)!bVar38 * tray.dir.field_0._24_4_;
      bVar38 = (bool)((byte)(uVar30 >> 3) & 1);
      auVar47._12_4_ = (uint)bVar38 * iVar58 | (uint)!bVar38 * tray.dir.field_0._28_4_;
      auVar44 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar44);
      uVar30 = vcmpps_avx512vl(auVar44,auVar45,1);
      bVar38 = (bool)((byte)uVar30 & 1);
      auVar44._0_4_ = (uint)bVar38 * iVar41 | (uint)!bVar38 * (int)fVar7;
      bVar38 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar44._4_4_ = (uint)bVar38 * iVar56 | (uint)!bVar38 * (int)fVar8;
      bVar38 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar44._8_4_ = (uint)bVar38 * iVar57 | (uint)!bVar38 * (int)fVar9;
      bVar38 = (bool)((byte)(uVar30 >> 3) & 1);
      auVar44._12_4_ = (uint)bVar38 * iVar58 | (uint)!bVar38 * (int)fVar10;
      auVar45 = vrcp14ps_avx512vl(auVar46);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar92 = ZEXT1664(auVar43);
      auVar42 = ZEXT816(0);
      auVar48 = vfnmadd213ps_avx512vl(auVar46,auVar45,auVar43);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar48,auVar45,auVar45)
      ;
      auVar45 = vrcp14ps_avx512vl(auVar47);
      auVar48 = vfnmadd213ps_avx512vl(auVar47,auVar45,auVar43);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar48,auVar45,auVar45)
      ;
      auVar45 = vrcp14ps_avx512vl(auVar44);
      auVar44 = vfnmadd213ps_avx512vl(auVar44,auVar45,auVar43);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar44,auVar45,auVar45)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      uVar30 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar42,1);
      auVar44 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar44._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar30 & 1) * auVar44._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar44._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar44._12_4_;
      uVar30 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar42,5);
      auVar44 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar38 = (bool)((byte)uVar30 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar38 * auVar44._0_4_ | (uint)!bVar38 * 0x60;
      bVar38 = (bool)((byte)(uVar30 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar38 * auVar44._4_4_ | (uint)!bVar38 * 0x60;
      bVar38 = (bool)((byte)(uVar30 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar38 * auVar44._8_4_ | (uint)!bVar38 * 0x60;
      bVar38 = (bool)((byte)(uVar30 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar38 * auVar44._12_4_ | (uint)!bVar38 * 0x60;
      uVar30 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar42,5);
      auVar44 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar38 = (bool)((byte)uVar30 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar38 * auVar44._0_4_ | (uint)!bVar38 * 0xa0;
      bVar38 = (bool)((byte)(uVar30 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar38 * auVar44._4_4_ | (uint)!bVar38 * 0xa0;
      bVar38 = (bool)((byte)(uVar30 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar38 * auVar44._8_4_ | (uint)!bVar38 * 0xa0;
      bVar38 = (bool)((byte)(uVar30 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar38 * auVar44._12_4_ | (uint)!bVar38 * 0xa0;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar94 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar44 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar42);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar29 & 1) * auVar44._0_4_ |
           (uint)!(bool)(bVar29 & 1) * stack_near[0].field_0._0_4_;
      bVar38 = (bool)((byte)(uVar39 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar38 * auVar44._4_4_ | (uint)!bVar38 * stack_near[0].field_0._4_4_;
      bVar38 = (bool)((byte)(uVar39 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar38 * auVar44._8_4_ | (uint)!bVar38 * stack_near[0].field_0._8_4_;
      bVar38 = SUB81(uVar39 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar38 * auVar44._12_4_ | (uint)!bVar38 * stack_near[0].field_0._12_4_;
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar93 = ZEXT1664(auVar44);
      auVar49 = vmaxps_avx512vl(auVar49,auVar42);
      tray.tfar.field_0.i[0] =
           (uint)(bVar29 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar44._0_4_;
      bVar38 = (bool)((byte)(uVar39 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar38 * auVar49._4_4_ | (uint)!bVar38 * auVar44._4_4_;
      bVar38 = (bool)((byte)(uVar39 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar38 * auVar49._8_4_ | (uint)!bVar38 * auVar44._8_4_;
      bVar38 = SUB81(uVar39 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar38 * auVar49._12_4_ | (uint)!bVar38 * auVar44._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar35 = 3;
      }
      else {
        uVar35 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      uVar32 = (ushort)uVar39 ^ 0xf;
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar37 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar95 = ZEXT1664(auVar49);
      do {
        paVar37 = paVar37 + -1;
        root.ptr = pNVar33[-1].ptr;
        pNVar33 = pNVar33 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00821c09:
          iVar41 = 3;
        }
        else {
          aVar1 = *paVar37;
          uVar39 = vcmpps_avx512vl((undefined1  [16])aVar1,(undefined1  [16])tray.tfar.field_0,1);
          if ((char)uVar39 == '\0') {
LAB_00821c0d:
            iVar41 = 2;
          }
          else {
            uVar36 = (undefined4)uVar39;
            iVar41 = 0;
            if ((uint)POPCOUNT(uVar36) <= uVar35) {
              do {
                sVar34 = 0;
                for (uVar30 = uVar39; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000)
                {
                  sVar34 = sVar34 + 1;
                }
                bVar38 = occluded1(This,bvh,root,sVar34,&pre,ray,&tray,context);
                bVar26 = (byte)(1 << ((uint)sVar34 & 0x1f));
                if (!bVar38) {
                  bVar26 = 0;
                }
                bVar26 = (byte)uVar32 | bVar26;
                uVar32 = (ushort)bVar26;
                uVar39 = uVar39 - 1 & uVar39;
              } while (uVar39 != 0);
              if (bVar26 == 0xf) {
                iVar41 = 3;
              }
              else {
                auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                tray.tfar.field_0.i[0] =
                     (uint)(bVar26 & 1) * auVar49._0_4_ |
                     (uint)!(bool)(bVar26 & 1) * tray.tfar.field_0.i[0];
                bVar38 = (bool)(bVar26 >> 1 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar38 * auVar49._4_4_ | (uint)!bVar38 * tray.tfar.field_0.i[1];
                bVar38 = (bool)(bVar26 >> 2 & 1);
                tray.tfar.field_0.i[2] =
                     (uint)bVar38 * auVar49._8_4_ | (uint)!bVar38 * tray.tfar.field_0.i[2];
                bVar38 = (bool)(bVar26 >> 3 & 1);
                tray.tfar.field_0.i[3] =
                     (uint)bVar38 * auVar49._12_4_ | (uint)!bVar38 * tray.tfar.field_0.i[3];
                iVar41 = 2;
              }
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar90 = ZEXT1664(auVar49);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar91 = ZEXT1664(auVar49);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar92 = ZEXT1664(auVar49);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar93 = ZEXT1664(auVar49);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar94 = ZEXT1664(auVar49);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar95 = ZEXT1664(auVar49);
            }
            auVar96 = ZEXT1664((undefined1  [16])aVar1);
            if (uVar35 < (uint)POPCOUNT(uVar36)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00821c09;
                  uVar14 = vcmpps_avx512vl(auVar96._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                  if ((char)uVar14 != '\0') {
                    bVar26 = (byte)uVar32 & 0xf;
                    if (bVar26 == 0xf) {
                      bVar28 = 0;
                    }
                    else {
                      uVar39 = (ulong)(bVar26 ^ 0xf);
                      bVar26 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar3 = This->leafIntersector;
                      bVar28 = 0;
                      do {
                        lVar15 = 0;
                        for (uVar30 = uVar39; (uVar30 & 1) == 0;
                            uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                          lVar15 = lVar15 + 1;
                        }
                        cVar27 = (**(code **)((long)pvVar3 + (ulong)bVar26 * 0x40 + 0x18))
                                           (&pre,ray,lVar15,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        bVar31 = (byte)(1 << ((uint)lVar15 & 0x1f));
                        if (cVar27 == '\0') {
                          bVar31 = 0;
                        }
                        bVar28 = bVar28 | bVar31;
                        uVar39 = uVar39 - 1 & uVar39;
                      } while (uVar39 != 0);
                    }
                    bVar28 = (byte)uVar32 | bVar28;
                    uVar32 = (ushort)bVar28;
                    if (bVar28 == 0xf) {
                      iVar41 = 3;
                    }
                    else {
                      auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      tray.tfar.field_0.i[0] =
                           (uint)(bVar28 & 1) * auVar49._0_4_ |
                           (uint)!(bool)(bVar28 & 1) * tray.tfar.field_0.i[0];
                      bVar38 = (bool)(bVar28 >> 1 & 1);
                      tray.tfar.field_0.i[1] =
                           (uint)bVar38 * auVar49._4_4_ | (uint)!bVar38 * tray.tfar.field_0.i[1];
                      bVar38 = (bool)(bVar28 >> 2 & 1);
                      tray.tfar.field_0.i[2] =
                           (uint)bVar38 * auVar49._8_4_ | (uint)!bVar38 * tray.tfar.field_0.i[2];
                      bVar38 = (bool)(bVar28 >> 3 & 1);
                      tray.tfar.field_0.i[3] =
                           (uint)bVar38 * auVar49._12_4_ | (uint)!bVar38 * tray.tfar.field_0.i[3];
                      iVar41 = 0;
                    }
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar90 = ZEXT1664(auVar49);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar91 = ZEXT1664(auVar49);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar92 = ZEXT1664(auVar49);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar93 = ZEXT1664(auVar49);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar94 = ZEXT1664(auVar49);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar95 = ZEXT1664(auVar49);
                    break;
                  }
                  goto LAB_00821c0d;
                }
                uVar30 = root.ptr & 0xfffffffffffffff0;
                auVar96 = ZEXT1664(auVar94._0_16_);
                uVar39 = 0;
                sVar34 = 8;
                do {
                  sVar2 = *(size_t *)(uVar30 + uVar39 * 8);
                  if (sVar2 != 8) {
                    if ((root.ptr & 7) == 0) {
                      uVar36 = *(undefined4 *)(root.ptr + 0x40 + uVar39 * 4);
                      auVar64._4_4_ = uVar36;
                      auVar64._0_4_ = uVar36;
                      auVar64._8_4_ = uVar36;
                      auVar64._12_4_ = uVar36;
                      auVar45 = vfmsub132ps_fma(auVar64,(undefined1  [16])
                                                        tray.org_rdir.field_0.field_0.x.field_0,
                                                (undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0);
                      uVar36 = *(undefined4 *)(root.ptr + 0x80 + uVar39 * 4);
                      auVar68._4_4_ = uVar36;
                      auVar68._0_4_ = uVar36;
                      auVar68._8_4_ = uVar36;
                      auVar68._12_4_ = uVar36;
                      auVar43 = vfmsub132ps_fma(auVar68,(undefined1  [16])
                                                        tray.org_rdir.field_0.field_0.y.field_0,
                                                (undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0);
                      uVar36 = *(undefined4 *)(root.ptr + 0xc0 + uVar39 * 4);
                      auVar76._4_4_ = uVar36;
                      auVar76._0_4_ = uVar36;
                      auVar76._8_4_ = uVar36;
                      auVar76._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(root.ptr + 0x60 + uVar39 * 4);
                      auVar16._4_4_ = uVar36;
                      auVar16._0_4_ = uVar36;
                      auVar16._8_4_ = uVar36;
                      auVar16._12_4_ = uVar36;
                      auVar42 = vfmsub132ps_avx512vl
                                          ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                           (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0
                                           ,auVar16);
                      uVar36 = *(undefined4 *)(root.ptr + 0xa0 + uVar39 * 4);
                      auVar17._4_4_ = uVar36;
                      auVar17._0_4_ = uVar36;
                      auVar17._8_4_ = uVar36;
                      auVar17._12_4_ = uVar36;
                      auVar50 = vfmsub132ps_avx512vl
                                          ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                           (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0
                                           ,auVar17);
                      auVar48 = vfmsub132ps_fma(auVar76,(undefined1  [16])
                                                        tray.org_rdir.field_0.field_0.z.field_0,
                                                (undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0);
                      uVar36 = *(undefined4 *)(root.ptr + 0xe0 + uVar39 * 4);
                      auVar18._4_4_ = uVar36;
                      auVar18._0_4_ = uVar36;
                      auVar18._8_4_ = uVar36;
                      auVar18._12_4_ = uVar36;
                      auVar51 = vfmsub132ps_avx512vl
                                          ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,
                                           (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0
                                           ,auVar18);
                      auVar49 = vpminsd_avx(auVar45,auVar42);
                      auVar44 = vpminsd_avx(auVar43,auVar50);
                      auVar49 = vpmaxsd_avx(auVar49,auVar44);
                      auVar44 = vpminsd_avx(auVar48,auVar51);
                      auVar49 = vpmaxsd_avx(auVar49,auVar44);
                      auVar44 = vpmaxsd_avx(auVar45,auVar42);
                      auVar45 = vpmaxsd_avx(auVar43,auVar50);
                      auVar45 = vpminsd_avx(auVar44,auVar45);
                      auVar44 = vpmaxsd_avx(auVar48,auVar51);
                      auVar45 = vpminsd_avx(auVar45,auVar44);
                      auVar44 = vpmaxsd_avx(auVar49,(undefined1  [16])tray.tnear.field_0);
                      auVar45 = vpminsd_avx(auVar45,(undefined1  [16])tray.tfar.field_0);
                      uVar40 = vpcmpd_avx512vl(auVar44,auVar45,2);
                      uVar40 = uVar40 & 0xf;
                    }
                    else {
                      uVar36 = *(undefined4 *)(uVar30 + 0x40 + uVar39 * 4);
                      auVar61._4_4_ = uVar36;
                      auVar61._0_4_ = uVar36;
                      auVar61._8_4_ = uVar36;
                      auVar61._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(uVar30 + 0x60 + uVar39 * 4);
                      auVar60._4_4_ = uVar36;
                      auVar60._0_4_ = uVar36;
                      auVar60._8_4_ = uVar36;
                      auVar60._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(uVar30 + 0x80 + uVar39 * 4);
                      auVar59._4_4_ = uVar36;
                      auVar59._0_4_ = uVar36;
                      auVar59._8_4_ = uVar36;
                      auVar59._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(uVar30 + 0xa0 + uVar39 * 4);
                      auVar85._4_4_ = uVar36;
                      auVar85._0_4_ = uVar36;
                      auVar85._8_4_ = uVar36;
                      auVar85._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(uVar30 + 0xc0 + uVar39 * 4);
                      auVar82._4_4_ = uVar36;
                      auVar82._0_4_ = uVar36;
                      auVar82._8_4_ = uVar36;
                      auVar82._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(uVar30 + 0xe0 + uVar39 * 4);
                      auVar72._4_4_ = uVar36;
                      auVar72._0_4_ = uVar36;
                      auVar72._8_4_ = uVar36;
                      auVar72._12_4_ = uVar36;
                      fVar7 = *(float *)(uVar30 + 0x100 + uVar39 * 4);
                      auVar69._4_4_ = fVar7;
                      auVar69._0_4_ = fVar7;
                      auVar69._8_4_ = fVar7;
                      auVar69._12_4_ = fVar7;
                      fVar8 = *(float *)(uVar30 + 0x120 + uVar39 * 4);
                      auVar66._4_4_ = fVar8;
                      auVar66._0_4_ = fVar8;
                      auVar66._8_4_ = fVar8;
                      auVar66._12_4_ = fVar8;
                      fVar9 = *(float *)(uVar30 + 0x140 + uVar39 * 4);
                      auVar63._4_4_ = fVar9;
                      auVar63._0_4_ = fVar9;
                      auVar63._8_4_ = fVar9;
                      auVar63._12_4_ = fVar9;
                      auVar23._4_4_ = tray.org.field_0._4_4_;
                      auVar23._0_4_ = tray.org.field_0._0_4_;
                      auVar23._8_4_ = tray.org.field_0._8_4_;
                      auVar23._12_4_ = tray.org.field_0._12_4_;
                      auVar24._4_4_ = tray.org.field_0._20_4_;
                      auVar24._0_4_ = tray.org.field_0._16_4_;
                      auVar24._8_4_ = tray.org.field_0._24_4_;
                      auVar24._12_4_ = tray.org.field_0._28_4_;
                      auVar25._4_4_ = tray.org.field_0._36_4_;
                      auVar25._0_4_ = tray.org.field_0._32_4_;
                      auVar25._8_4_ = tray.org.field_0._40_4_;
                      auVar25._12_4_ = tray.org.field_0._44_4_;
                      auVar49._0_4_ = (float)tray.dir.field_0._32_4_ * fVar7;
                      auVar49._4_4_ = (float)tray.dir.field_0._36_4_ * fVar7;
                      auVar49._8_4_ = (float)tray.dir.field_0._40_4_ * fVar7;
                      auVar49._12_4_ = (float)tray.dir.field_0._44_4_ * fVar7;
                      auVar45._0_4_ = (float)tray.dir.field_0._32_4_ * fVar8;
                      auVar45._4_4_ = (float)tray.dir.field_0._36_4_ * fVar8;
                      auVar45._8_4_ = (float)tray.dir.field_0._40_4_ * fVar8;
                      auVar45._12_4_ = (float)tray.dir.field_0._44_4_ * fVar8;
                      auVar79._0_4_ = (float)tray.dir.field_0._32_4_ * fVar9;
                      auVar79._4_4_ = (float)tray.dir.field_0._36_4_ * fVar9;
                      auVar79._8_4_ = (float)tray.dir.field_0._40_4_ * fVar9;
                      auVar79._12_4_ = (float)tray.dir.field_0._44_4_ * fVar9;
                      auVar49 = vfmadd231ps_avx512vl
                                          (auVar49,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar85);
                      auVar44 = vfmadd231ps_avx512vl
                                          (auVar45,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar82);
                      auVar45 = vfmadd231ps_avx512vl
                                          (auVar79,auVar72,
                                           (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                      auVar49 = vfmadd231ps_fma(auVar49,(undefined1  [16])
                                                        tray.dir.field_0.field_0.x.field_0,auVar61);
                      auVar44 = vfmadd231ps_fma(auVar44,(undefined1  [16])
                                                        tray.dir.field_0.field_0.x.field_0,auVar60);
                      auVar45 = vfmadd231ps_fma(auVar45,auVar59,
                                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0
                                               );
                      auVar48 = auVar90._0_16_;
                      auVar43 = vandps_avx512vl(auVar49,auVar48);
                      auVar42 = auVar91._0_16_;
                      uVar40 = vcmpps_avx512vl(auVar43,auVar42,1);
                      bVar38 = (bool)((byte)uVar40 & 1);
                      iVar41 = auVar91._0_4_;
                      auVar52._0_4_ = (uint)bVar38 * iVar41 | (uint)!bVar38 * auVar49._0_4_;
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      iVar56 = auVar91._4_4_;
                      auVar52._4_4_ = (uint)bVar38 * iVar56 | (uint)!bVar38 * auVar49._4_4_;
                      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
                      iVar57 = auVar91._8_4_;
                      iVar58 = auVar91._12_4_;
                      auVar52._8_4_ = (uint)bVar38 * iVar57 | (uint)!bVar38 * auVar49._8_4_;
                      bVar38 = (bool)((byte)(uVar40 >> 3) & 1);
                      auVar52._12_4_ = (uint)bVar38 * iVar58 | (uint)!bVar38 * auVar49._12_4_;
                      auVar49 = vandps_avx512vl(auVar44,auVar48);
                      uVar40 = vcmpps_avx512vl(auVar49,auVar42,1);
                      bVar38 = (bool)((byte)uVar40 & 1);
                      auVar53._0_4_ = (uint)bVar38 * iVar41 | (uint)!bVar38 * auVar44._0_4_;
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      auVar53._4_4_ = (uint)bVar38 * iVar56 | (uint)!bVar38 * auVar44._4_4_;
                      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
                      auVar53._8_4_ = (uint)bVar38 * iVar57 | (uint)!bVar38 * auVar44._8_4_;
                      bVar38 = (bool)((byte)(uVar40 >> 3) & 1);
                      auVar53._12_4_ = (uint)bVar38 * iVar58 | (uint)!bVar38 * auVar44._12_4_;
                      auVar49 = vandps_avx512vl(auVar45,auVar48);
                      uVar40 = vcmpps_avx512vl(auVar49,auVar42,1);
                      bVar38 = (bool)((byte)uVar40 & 1);
                      auVar54._0_4_ = (uint)bVar38 * iVar41 | (uint)!bVar38 * auVar45._0_4_;
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      auVar54._4_4_ = (uint)bVar38 * iVar56 | (uint)!bVar38 * auVar45._4_4_;
                      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
                      auVar54._8_4_ = (uint)bVar38 * iVar57 | (uint)!bVar38 * auVar45._8_4_;
                      bVar38 = (bool)((byte)(uVar40 >> 3) & 1);
                      auVar54._12_4_ = (uint)bVar38 * iVar58 | (uint)!bVar38 * auVar45._12_4_;
                      auVar49 = vrcp14ps_avx512vl(auVar52);
                      auVar43 = auVar92._0_16_;
                      auVar44 = vfnmadd213ps_avx512vl(auVar52,auVar49,auVar43);
                      auVar49 = vfmadd132ps_fma(auVar44,auVar49,auVar49);
                      auVar44 = vrcp14ps_avx512vl(auVar53);
                      auVar45 = vfnmadd213ps_avx512vl(auVar53,auVar44,auVar43);
                      auVar44 = vfmadd132ps_fma(auVar45,auVar44,auVar44);
                      auVar45 = vrcp14ps_avx512vl(auVar54);
                      auVar43 = vfnmadd213ps_avx512vl(auVar54,auVar45,auVar43);
                      auVar45 = vfmadd132ps_fma(auVar43,auVar45,auVar45);
                      auVar42 = auVar95._0_16_;
                      auVar50 = vxorps_avx512vl(auVar49,auVar42);
                      auVar51 = vxorps_avx512vl(auVar44,auVar42);
                      uVar36 = *(undefined4 *)(uVar30 + 0x160 + uVar39 * 4);
                      auVar19._4_4_ = uVar36;
                      auVar19._0_4_ = uVar36;
                      auVar19._8_4_ = uVar36;
                      auVar19._12_4_ = uVar36;
                      auVar43 = vfmadd213ps_avx512vl(auVar69,auVar25,auVar19);
                      uVar36 = *(undefined4 *)(uVar30 + 0x180 + uVar39 * 4);
                      auVar20._4_4_ = uVar36;
                      auVar20._0_4_ = uVar36;
                      auVar20._8_4_ = uVar36;
                      auVar20._12_4_ = uVar36;
                      auVar48 = vfmadd213ps_avx512vl(auVar66,auVar25,auVar20);
                      auVar55 = vxorps_avx512vl(auVar45,auVar42);
                      uVar36 = *(undefined4 *)(uVar30 + 0x1a0 + uVar39 * 4);
                      auVar21._4_4_ = uVar36;
                      auVar21._0_4_ = uVar36;
                      auVar21._8_4_ = uVar36;
                      auVar21._12_4_ = uVar36;
                      auVar42 = vfmadd213ps_avx512vl(auVar63,auVar25,auVar21);
                      auVar43 = vfmadd231ps_fma(auVar43,auVar24,auVar85);
                      auVar48 = vfmadd231ps_fma(auVar48,auVar24,auVar82);
                      auVar42 = vfmadd231ps_fma(auVar42,auVar24,auVar72);
                      auVar43 = vfmadd231ps_fma(auVar43,auVar23,auVar61);
                      auVar62._0_4_ = auVar50._0_4_ * auVar43._0_4_;
                      auVar62._4_4_ = auVar50._4_4_ * auVar43._4_4_;
                      auVar62._8_4_ = auVar50._8_4_ * auVar43._8_4_;
                      auVar62._12_4_ = auVar50._12_4_ * auVar43._12_4_;
                      auVar43 = vfmadd231ps_fma(auVar48,auVar23,auVar60);
                      auVar48 = vmulps_avx512vl(auVar43,auVar51);
                      auVar43 = vfmadd231ps_fma(auVar42,auVar23,auVar59);
                      auVar43 = vmulps_avx512vl(auVar43,auVar55);
                      auVar65._0_4_ = auVar49._0_4_ + auVar62._0_4_;
                      auVar65._4_4_ = auVar49._4_4_ + auVar62._4_4_;
                      auVar65._8_4_ = auVar49._8_4_ + auVar62._8_4_;
                      auVar65._12_4_ = auVar49._12_4_ + auVar62._12_4_;
                      auVar67._0_4_ = auVar44._0_4_ + auVar48._0_4_;
                      auVar67._4_4_ = auVar44._4_4_ + auVar48._4_4_;
                      auVar67._8_4_ = auVar44._8_4_ + auVar48._8_4_;
                      auVar67._12_4_ = auVar44._12_4_ + auVar48._12_4_;
                      auVar70._0_4_ = auVar45._0_4_ + auVar43._0_4_;
                      auVar70._4_4_ = auVar45._4_4_ + auVar43._4_4_;
                      auVar70._8_4_ = auVar45._8_4_ + auVar43._8_4_;
                      auVar70._12_4_ = auVar45._12_4_ + auVar43._12_4_;
                      auVar49 = vpminsd_avx(auVar62,auVar65);
                      auVar44 = vpminsd_avx(auVar48,auVar67);
                      auVar49 = vpmaxsd_avx(auVar49,auVar44);
                      auVar44 = vpminsd_avx(auVar43,auVar70);
                      auVar49 = vpmaxsd_avx(auVar49,auVar44);
                      auVar44 = vpmaxsd_avx(auVar62,auVar65);
                      auVar45 = vpmaxsd_avx(auVar48,auVar67);
                      auVar45 = vpminsd_avx(auVar44,auVar45);
                      auVar44 = vpmaxsd_avx(auVar43,auVar70);
                      auVar45 = vpminsd_avx(auVar45,auVar44);
                      auVar44 = vpmaxsd_avx(auVar49,(undefined1  [16])tray.tnear.field_0);
                      auVar45 = vpminsd_avx(auVar45,(undefined1  [16])tray.tfar.field_0);
                      uVar40 = vcmpps_avx512vl(auVar44,auVar45,2);
                    }
                    if ((uVar40 & 0xf) != 0) {
                      auVar44 = vblendmps_avx512vl(auVar94._0_16_,auVar49);
                      bVar38 = (bool)((byte)uVar40 & 1);
                      bVar4 = (bool)((byte)(uVar40 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar40 >> 2) & 1);
                      bVar6 = (bool)((byte)(uVar40 >> 3) & 1);
                      if (sVar34 != 8) {
                        pNVar33->ptr = sVar34;
                        pNVar33 = pNVar33 + 1;
                        *paVar37 = auVar96._0_16_;
                        paVar37 = paVar37 + 1;
                      }
                      auVar96 = ZEXT1664(CONCAT412((uint)bVar6 * auVar44._12_4_ |
                                                   (uint)!bVar6 * auVar49._12_4_,
                                                   CONCAT48((uint)bVar5 * auVar44._8_4_ |
                                                            (uint)!bVar5 * auVar49._8_4_,
                                                            CONCAT44((uint)bVar4 * auVar44._4_4_ |
                                                                     (uint)!bVar4 * auVar49._4_4_,
                                                                     (uint)bVar38 * auVar44._0_4_ |
                                                                     (uint)!bVar38 * auVar49._0_4_))
                                                  ));
                      sVar34 = sVar2;
                    }
                  }
                } while ((sVar2 != 8) && (bVar38 = uVar39 < 7, uVar39 = uVar39 + 1, bVar38));
                iVar41 = 0;
                if (sVar34 == 8) {
LAB_00821abf:
                  bVar38 = false;
                  iVar41 = 4;
                }
                else {
                  uVar14 = vcmpps_avx512vl((undefined1  [16])auVar96._0_16_,
                                           (undefined1  [16])tray.tfar.field_0,9);
                  bVar38 = true;
                  if ((uint)POPCOUNT((int)uVar14) <= uVar35) {
                    pNVar33->ptr = sVar34;
                    pNVar33 = pNVar33 + 1;
                    *paVar37 = auVar96._0_16_;
                    paVar37 = paVar37 + 1;
                    goto LAB_00821abf;
                  }
                }
                root.ptr = sVar34;
              } while (bVar38);
            }
          }
        }
      } while (iVar41 != 3);
      bVar29 = (byte)uVar32 & bVar29;
      bVar38 = (bool)(bVar29 >> 1 & 1);
      bVar4 = (bool)(bVar29 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar29 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar29 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar38 * auVar93._4_4_ | (uint)!bVar38 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar4 * auVar93._8_4_ | (uint)!bVar4 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar29 >> 3) * auVar93._12_4_ | (uint)!(bool)(bVar29 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }